

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

void audit_regressor_lda(audit_regressor_data *rd,single_learner *param_2,example *ec)

{
  vw *pvVar1;
  vw *pvVar2;
  io_buf *this;
  ostream *poVar3;
  weight *pwVar4;
  size_t k;
  ulong uVar5;
  byte *pbVar6;
  features *pfVar7;
  size_t j;
  ulong uVar8;
  string local_1e8 [8];
  uint local_1e0;
  char *local_1c8 [4];
  ostringstream tempstream;
  
  pvVar1 = rd->all;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tempstream);
  pvVar2 = rd->all;
  for (pbVar6 = (ec->super_example_predict).indices._begin;
      pbVar6 != (ec->super_example_predict).indices._end; pbVar6 = pbVar6 + 1) {
    pfVar7 = (ec->super_example_predict).feature_space + *pbVar6;
    for (uVar8 = 0;
        uVar8 < (ulong)((long)(pfVar7->values)._end - (long)(pfVar7->values)._begin >> 2);
        uVar8 = uVar8 + 1) {
      poVar3 = std::operator<<((ostream *)&tempstream,'\t');
      poVar3 = std::operator<<(poVar3,(string *)
                                      (pfVar7->space_names)._begin[uVar8].
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
      poVar3 = std::operator<<(poVar3,'^');
      poVar3 = std::operator<<(poVar3,(string *)
                                      &((pfVar7->space_names)._begin[uVar8].
                                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->second);
      poVar3 = std::operator<<(poVar3,':');
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      for (uVar5 = 0; uVar5 < pvVar1->lda; uVar5 = uVar5 + 1) {
        pwVar4 = parameters::operator[](&pvVar2->weights,(pfVar7->indicies)._begin[uVar8] + uVar5);
        poVar3 = std::operator<<((ostream *)&tempstream,':');
        std::ostream::operator<<(poVar3,*pwVar4);
        *pwVar4 = 0.0;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&tempstream);
    }
  }
  this = rd->out_file;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  io_buf::bin_write_fixed(this,local_1c8[0],(ulong)local_1e0);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tempstream);
  return;
}

Assistant:

void audit_regressor_lda(audit_regressor_data& rd, LEARNER::single_learner& /* base */, example& ec)
{
  vw& all = *rd.all;

  ostringstream tempstream;
  parameters& weights = rd.all->weights;
  for (unsigned char* i = ec.indices.begin(); i != ec.indices.end(); i++)
  {
    features& fs = ec.feature_space[*i];
    for (size_t j = 0; j < fs.size(); ++j)
    {
      tempstream << '\t' << fs.space_names[j].get()->first << '^' << fs.space_names[j].get()->second << ':'
                 << ((fs.indicies[j] >> weights.stride_shift()) & all.parse_mask);
      for (size_t k = 0; k < all.lda; k++)
      {
        weight& w = weights[(fs.indicies[j] + k)];
        tempstream << ':' << w;
        w = 0.;
      }
      tempstream << endl;
    }
  }

  rd.out_file->bin_write_fixed(tempstream.str().c_str(), (uint32_t)tempstream.str().size());
}